

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardSubsumptionDemodulation.cpp
# Opt level: O1

bool __thiscall
Inferences::BackwardSubsumptionDemodulation::simplifyCandidate
          (BackwardSubsumptionDemodulation *this,Clause *sideCl,Clause *mainCl,
          vector<Inferences::BwSimplificationRecord,_std::allocator<Inferences::BwSimplificationRecord>_>
          *simplifications)

{
  Literal *base;
  Literal *instance;
  List<Kernel::Literal_*> *pLVar1;
  pointer ppLVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  List<Kernel::Literal_*> *pLVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_BackwardSubsumptionDemodulation_cpp:309:5)>
  on_scope_exit_guard_on_line_313;
  Clause *replacement;
  uint local_6c;
  ScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_BackwardSubsumptionDemodulation_cpp:309:5)>
  local_68;
  Clause *local_60;
  Clause *local_58;
  BackwardSubsumptionDemodulation *local_50;
  vector<Inferences::BwSimplificationRecord,std::allocator<Inferences::BwSimplificationRecord>>
  *local_48;
  FixedSizeAllocator<16UL> *local_40;
  Clause *local_38;
  
  local_60 = mainCl;
  local_50 = this;
  local_48 = (vector<Inferences::BwSimplificationRecord,std::allocator<Inferences::BwSimplificationRecord>>
              *)simplifications;
  if (simplifyCandidate(Kernel::Clause*,Kernel::Clause*,std::vector<Inferences::BwSimplificationRecord,std::allocator<Inferences::BwSimplificationRecord>>&)
      ::alts == '\0') {
    simplifyCandidate();
  }
  if (simplifyCandidate::alts.
      super__Vector_base<Lib::List<Kernel::Literal_*>_*,_std::allocator<Lib::List<Kernel::Literal_*>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      simplifyCandidate::alts.
      super__Vector_base<Lib::List<Kernel::Literal_*>_*,_std::allocator<Lib::List<Kernel::Literal_*>_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    simplifyCandidate::alts.
    super__Vector_base<Lib::List<Kernel::Literal_*>_*,_std::allocator<Lib::List<Kernel::Literal_*>_*>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         simplifyCandidate::alts.
         super__Vector_base<Lib::List<Kernel::Literal_*>_*,_std::allocator<Lib::List<Kernel::Literal_*>_*>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  local_68.active = false;
  local_68._1_3_ = 0;
  local_68.exception_count = 0;
  std::vector<Lib::List<Kernel::Literal_*>_*,_std::allocator<Lib::List<Kernel::Literal_*>_*>_>::
  resize(&simplifyCandidate::alts,(ulong)((uint)*(undefined8 *)&sideCl->field_0x38 & 0xfffff),
         (value_type *)&local_68);
  if ((*(uint *)&sideCl->field_0x38 & 0xfffff) == 0) {
    local_68.active = true;
    iVar5 = std::uncaught_exceptions();
    local_68.exception_count = iVar5;
LAB_004b92ee:
    if ((simplifyCandidate(Kernel::Clause*,Kernel::Clause*,std::vector<Inferences::BwSimplificationRecord,std::allocator<Inferences::BwSimplificationRecord>>&)
         ::matcher == '\0') &&
       (iVar5 = __cxa_guard_acquire(&simplifyCandidate(Kernel::Clause*,Kernel::Clause*,std::vector<Inferences::BwSimplificationRecord,std::allocator<Inferences::BwSimplificationRecord>>&)
                                     ::matcher), iVar5 != 0)) {
      Kernel::MLMatcherSD::MLMatcherSD(&simplifyCandidate::matcher);
      __cxa_atexit(Kernel::MLMatcherSD::~MLMatcherSD,&simplifyCandidate::matcher,&__dso_handle);
      __cxa_guard_release(&simplifyCandidate(Kernel::Clause*,Kernel::Clause*,std::vector<Inferences::BwSimplificationRecord,std::allocator<Inferences::BwSimplificationRecord>>&)
                           ::matcher);
    }
    Kernel::MLMatcherSD::init(&simplifyCandidate::matcher,(EVP_PKEY_CTX *)sideCl->_literals);
    if ((simplifyCandidate(Kernel::Clause*,Kernel::Clause*,std::vector<Inferences::BwSimplificationRecord,std::allocator<Inferences::BwSimplificationRecord>>&)
         ::maxMatches == '\0') &&
       (iVar5 = __cxa_guard_acquire(&simplifyCandidate(Kernel::Clause*,Kernel::Clause*,std::vector<Inferences::BwSimplificationRecord,std::allocator<Inferences::BwSimplificationRecord>>&)
                                     ::maxMatches), iVar5 != 0)) {
      iVar5 = (*(local_50->super_BackwardSimplificationEngine).super_InferenceEngine.
                _vptr_InferenceEngine[4])();
      if (*(int *)(CONCAT44(extraout_var,iVar5) + 0x1c68) == 0) {
        simplifyCandidate::maxMatches = 0xffffffff;
      }
      else {
        iVar5 = (*(local_50->super_BackwardSimplificationEngine).super_InferenceEngine.
                  _vptr_InferenceEngine[4])();
        simplifyCandidate::maxMatches = *(uint *)(CONCAT44(extraout_var_00,iVar5) + 0x1c68);
      }
      __cxa_guard_release(&simplifyCandidate(Kernel::Clause*,Kernel::Clause*,std::vector<Inferences::BwSimplificationRecord,std::allocator<Inferences::BwSimplificationRecord>>&)
                           ::maxMatches);
    }
    uVar7 = 0;
    if (simplifyCandidate::maxMatches == 0) goto LAB_004b93a0;
    do {
      bVar3 = Kernel::MLMatcherSD::nextMatch(&simplifyCandidate::matcher);
      if (!bVar3) break;
      local_38 = (Clause *)0x0;
      bVar3 = rewriteCandidate(local_50,sideCl,local_60,&simplifyCandidate::matcher,&local_38);
      if ((bVar3) &&
         (std::
          vector<Inferences::BwSimplificationRecord,std::allocator<Inferences::BwSimplificationRecord>>
          ::emplace_back<Kernel::Clause*&,Kernel::Clause*&>(local_48,&local_60,&local_38), bVar3)) {
        uVar7 = 1;
        goto LAB_004b93a0;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < simplifyCandidate::maxMatches);
  }
  else {
    uVar9 = 0;
    local_40 = (FixedSizeAllocator<16UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18);
    local_6c = 0;
    local_58 = sideCl;
    do {
      base = local_58->_literals[uVar9];
      if ((*(uint *)&local_60->field_0x38 & 0xfffff) != 0) {
        uVar8 = 0;
        do {
          instance = local_60->_literals[uVar8];
          bVar3 = Kernel::MatchingUtils::match(base,instance,false);
          ppLVar2 = simplifyCandidate::alts.
                    super__Vector_base<Lib::List<Kernel::Literal_*>_*,_std::allocator<Lib::List<Kernel::Literal_*>_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (bVar3) {
            pLVar1 = simplifyCandidate::alts.
                     super__Vector_base<Lib::List<Kernel::Literal_*>_*,_std::allocator<Lib::List<Kernel::Literal_*>_*>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar9];
            pLVar6 = (List<Kernel::Literal_*> *)::Lib::FixedSizeAllocator<16UL>::alloc(local_40);
            pLVar6->_head = instance;
            pLVar6->_tail = pLVar1;
            ppLVar2[uVar9] = pLVar6;
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 < ((uint)*(undefined8 *)&local_60->field_0x38 & 0xfffff));
      }
      sideCl = local_58;
      bVar4 = 1;
      if (simplifyCandidate::alts.
          super__Vector_base<Lib::List<Kernel::Literal_*>_*,_std::allocator<Lib::List<Kernel::Literal_*>_*>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar9] == (List<Kernel::Literal_*> *)0x0) {
        if (local_6c == 0) {
          if ((base->super_Term)._functor == 0) {
            bVar4 = ((byte)(base->super_Term)._args[0]._content & 4) >> 2;
            local_6c = 2 - bVar4;
            goto LAB_004b928d;
          }
          local_6c = 2;
        }
        else {
          local_6c = local_6c + 1;
        }
        bVar4 = 0;
      }
LAB_004b928d:
    } while ((bVar4 != 0) &&
            (uVar9 = uVar9 + 1, uVar9 < ((uint)*(undefined8 *)&local_58->field_0x38 & 0xfffff)));
    local_68.active = true;
    iVar5 = std::uncaught_exceptions();
    local_68.exception_count = iVar5;
    if (local_6c < 2) goto LAB_004b92ee;
  }
  uVar7 = 0;
LAB_004b93a0:
  ::Lib::
  ScopeGuard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/BackwardSubsumptionDemodulation.cpp:309:5)>
  ::~ScopeGuard(&local_68);
  return SUB41(uVar7,0);
}

Assistant:

bool BackwardSubsumptionDemodulation::simplifyCandidate(Clause* sideCl, Clause* mainCl, std::vector<BwSimplificationRecord>& simplifications)
{
    static std::vector<LiteralList*> alts;

    alts.clear();
    alts.resize(sideCl->length(), LiteralList::empty());

    unsigned baseLitsWithoutAlternatives = 0;
    for (unsigned bi = 0; bi < sideCl->length(); ++bi) {
      Literal* baseLit = (*sideCl)[bi];

      for (unsigned ii = 0; ii < mainCl->length(); ++ii) {
        Literal* instLit = (*mainCl)[ii];
        if (MatchingUtils::match(baseLit, instLit, false)) {
          LiteralList::push(instLit, alts[bi]);
        }
      }  // for(ii)

      if (LiteralList::isEmpty(alts[bi])) {
        // baseLit does not have any suitable alternative at all!
        //
        // If there are base literals without any suitable alternatives:
        // 1. If there is only one literal without alternative and it is a positive equality,
        //    then it might still be possible to get an SD inference by choosing this literal
        //    as equality for demodulation.
        // 2. If there is a literal without alternative but it is not a positive equality,
        //    then it is impossible to get an SD inference.
        // 3. If there are two literals without alternatives, then it is impossible as well.
        //
        // (This check exists purely for performance reasons.
        // MLMatcher would exclude cases 2 and 3 as well, but with additional overhead.)
        baseLitsWithoutAlternatives += 1;
        if (baseLitsWithoutAlternatives == 1) {
          if (!baseLit->isEquality() || !baseLit->isPositive()) {
            // We are in case 2 => skip
            baseLitsWithoutAlternatives += 1;  // a hack so we don't need another variable to check whether to skip below (in other words, merge case 2 into case 3 for purpose of the "if" below)
            break;
          }
        } else {
          // We are in case 3 => skip
          ASS_G(baseLitsWithoutAlternatives, 1);
          break;
        }
      }
    }  // for(bi)

    // Ensure cleanup of LiteralLists
    ON_SCOPE_EXIT({
      for (LiteralList* ll : alts) {
        LiteralList::destroy(ll);
      }
    });

    // Skip due to missing alternatives? (see comment above, "baseLit does not have any suitable alternative")
    if (baseLitsWithoutAlternatives > 1) {
      RSTAT_CTR_INC("BSD, skipped candidate main premise due to baseLitsWithoutAlternatives");
      return false;
    }

    ASS_LE(baseLitsWithoutAlternatives, 1);
    ASS_EQ(sideCl->length(), alts.size());

    static MLMatcherSD matcher;
    matcher.init(sideCl, mainCl, alts.data());

    static unsigned const maxMatches =
      getOptions().backwardSubsumptionDemodulationMaxMatches() == 0
      ? std::numeric_limits<decltype(maxMatches)>::max()
      : getOptions().backwardSubsumptionDemodulationMaxMatches();

    unsigned numMatches = 0;
    for (; numMatches < maxMatches; ++numMatches) {
      if (!matcher.nextMatch()) {
        break;
      }

      Clause* replacement = nullptr;
      if (rewriteCandidate(sideCl, mainCl, matcher, replacement)) {
        RSTAT_MCTR_INC("BSD, successes by MLMatch", numMatches + 1);  // +1 so it fits with the previous output
        simplifications.emplace_back(mainCl, replacement);
        return true;
      }
    }  // for (numMatches)

    if (numMatches > 0) {
      RSTAT_CTR_INC("BSD, MLMatch but no subsumption demodulation");
    }

    return false;
}